

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.h
# Opt level: O0

void * htable_get(htable *ht,size_t h,_func__Bool_void_ptr_void_ptr *cmp,void *ptr)

{
  _Bool _Var1;
  void *local_40;
  void *c;
  htable_iter i;
  void *ptr_local;
  _func__Bool_void_ptr_void_ptr *cmp_local;
  size_t h_local;
  htable *ht_local;
  
  i.off = (size_t)ptr;
  local_40 = htable_firstval(ht,(htable_iter *)&c,h);
  while( true ) {
    if (local_40 == (void *)0x0) {
      return (void *)0x0;
    }
    _Var1 = (*cmp)(local_40,(void *)i.off);
    if (_Var1) break;
    local_40 = htable_nextval(ht,(htable_iter *)&c,h);
  }
  return local_40;
}

Assistant:

static inline void *htable_get(const struct htable *ht,
			       size_t h,
			       bool (*cmp)(const void *candidate, void *ptr),
			       const void *ptr)
{
	struct htable_iter i;
	void *c;

	for (c = htable_firstval(ht,&i,h); c; c = htable_nextval(ht,&i,h)) {
		if (cmp(c, (void *)ptr))
			return c;
	}
	return NULL;
}